

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

void __thiscall
PackageMempoolAcceptResult::PackageMempoolAcceptResult
          (PackageMempoolAcceptResult *this,uint256 *wtxid,MempoolAcceptResult *result)

{
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<const_uint256,_MempoolAcceptResult> *in_stack_fffffffffffffe48;
  uint256 *in_stack_fffffffffffffe50;
  pair<const_uint256,_MempoolAcceptResult> *in_stack_fffffffffffffe58;
  allocator_type *in_stack_fffffffffffffe90;
  long *plVar1;
  less<uint256> *__comp;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> in_stack_fffffffffffffeb0;
  less<uint256> local_10a [2];
  long local_108 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  PackageValidationState::PackageValidationState
            ((PackageValidationState *)in_stack_fffffffffffffe48);
  std::pair<const_uint256,_MempoolAcceptResult>::pair<const_uint256,_MempoolAcceptResult,_true>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             (MempoolAcceptResult *)in_stack_fffffffffffffe48);
  __comp = local_10a;
  std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>::allocator
            ((allocator<std::pair<const_uint256,_MempoolAcceptResult>_> *)in_stack_fffffffffffffe48)
  ;
  std::
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::map(in_RDI,in_stack_fffffffffffffeb0,__comp,in_stack_fffffffffffffe90);
  std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>::~allocator
            ((allocator<std::pair<const_uint256,_MempoolAcceptResult>_> *)in_stack_fffffffffffffe48)
  ;
  plVar1 = &local_8;
  do {
    plVar1 = plVar1 + -0x20;
    std::pair<const_uint256,_MempoolAcceptResult>::~pair(in_stack_fffffffffffffe48);
  } while (plVar1 != local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit PackageMempoolAcceptResult(const uint256& wtxid, const MempoolAcceptResult& result)
        : m_tx_results{ {wtxid, result} } {}